

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Detect.cpp
# Opt level: O2

bool overlapSC(SoftCluster *c,SoftNode *n)

{
  SoftNode *pSVar1;
  int iVar2;
  SoftNode *pSVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  SoftNode *pSVar7;
  uint uVar8;
  SoftNode cn;
  SoftNode local_a8;
  
  pSVar1 = (c->nodes).super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pSVar3 = (c->nodes).super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
           super__Vector_impl_data._M_start;
  do {
    pSVar7 = pSVar3;
    if (pSVar7 == pSVar1) break;
    SoftNode::SoftNode(&local_a8,pSVar7);
    uVar4 = n->scPos - local_a8.scPos;
    uVar8 = -uVar4;
    if (0 < (int)uVar4) {
      uVar8 = uVar4;
    }
    if (5 < uVar8) {
      SoftNode::~SoftNode(&local_a8);
      break;
    }
    iVar5 = alignSeq(&local_a8.seq,&n->seq);
    iVar2 = n->end;
    if (local_a8.end < n->end) {
      iVar2 = local_a8.end;
    }
    iVar6 = local_a8.start;
    if (local_a8.start < n->start) {
      iVar6 = n->start;
    }
    SoftNode::~SoftNode(&local_a8);
    pSVar3 = pSVar7 + 1;
  } while ((double)(iVar2 - iVar6) * 0.9 <= (double)iVar5);
  return pSVar7 == pSVar1;
}

Assistant:

bool overlapSC(const SoftCluster &c, const SoftNode &n)
{
	for (SoftNode cn : c.nodes)
	{
		if (abs(n.scPos - cn.scPos) > MAX_SC_OVERLAP_DISTANCE)
			return false;
		// compare reads in sorted order, first seq should be more towards 5` than second seq
		double alnScore = 1.0 * alignSeq(cn.seq, n.seq);
		double o_len = 1.0 * (std::min(n.end, cn.end) - std::max(n.start, cn.start));
		if (alnScore < ALN_THRESHOLD * o_len)
			return false;
	}
	return true;
}